

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void breakstat(LexState *ls)

{
  long in_RDI;
  int upval;
  BlockCnt *bl;
  FuncState *fs;
  int in_stack_ffffffffffffffc8;
  OpCode in_stack_ffffffffffffffcc;
  FuncState *in_stack_ffffffffffffffd0;
  FuncState *fs_00;
  int *l1;
  uint in_stack_ffffffffffffffe0;
  uint uVar1;
  uint uVar2;
  BlockCnt *local_18;
  
  fs_00 = *(FuncState **)(in_RDI + 0x30);
  local_18 = fs_00->bl;
  uVar2 = 0;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffe0 & 0xffffff;
    if (local_18 != (BlockCnt *)0x0) {
      uVar1 = CONCAT13(local_18->isbreakable != '\0',(int3)in_stack_ffffffffffffffe0) ^ 0xff000000;
    }
    if ((uVar1 & 0x1000000) == 0) break;
    uVar2 = local_18->upval | uVar2;
    local_18 = local_18->previous;
    in_stack_ffffffffffffffe0 = uVar1;
  }
  if (local_18 == (BlockCnt *)0x0) {
    luaX_syntaxerror((LexState *)in_stack_ffffffffffffffd0,
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (uVar2 != 0) {
    luaK_codeABC(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0,
                 0x115105);
  }
  l1 = &local_18->breaklist;
  luaK_jump(fs_00);
  luaK_concat((FuncState *)CONCAT44(uVar2,uVar1),l1,(int)((ulong)fs_00 >> 0x20));
  return;
}

Assistant:

static void breakstat(LexState*ls){
FuncState*fs=ls->fs;
BlockCnt*bl=fs->bl;
int upval=0;
while(bl&&!bl->isbreakable){
upval|=bl->upval;
bl=bl->previous;
}
if(!bl)
luaX_syntaxerror(ls,"no loop to break");
if(upval)
luaK_codeABC(fs,OP_CLOSE,bl->nactvar,0,0);
luaK_concat(fs,&bl->breaklist,luaK_jump(fs));
}